

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall
cmFindPackageCommand::ReadListFile(cmFindPackageCommand *this,char *f,PolicyScopeRule psr)

{
  bool bVar1;
  string e;
  string local_48;
  
  bVar1 = cmMakefile::ReadDependentFile
                    ((this->super_cmFindCommon).super_cmCommand.Makefile,f,
                     (bool)(this->PolicyScope ^ 1U | psr == NoPolicyScope));
  if (!bVar1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Error reading CMake code from \"","");
    std::__cxx11::string::append((char *)&local_48);
    std::__cxx11::string::append((char *)&local_48);
    cmCommand::SetError((cmCommand *)this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool cmFindPackageCommand::ReadListFile(const char* f, PolicyScopeRule psr)
{
  const bool noPolicyScope = !this->PolicyScope || psr == NoPolicyScope;
  if (this->Makefile->ReadDependentFile(f, noPolicyScope)) {
    return true;
  }
  std::string e = "Error reading CMake code from \"";
  e += f;
  e += "\".";
  this->SetError(e);
  return false;
}